

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O3

base_uint<256U> * __thiscall base_uint<256U>::operator*=(base_uint<256U> *this,base_uint<256U> *b)

{
  uint uVar1;
  long lVar2;
  int j;
  long lVar3;
  long lVar4;
  ulong uVar5;
  uint32_t *this_00;
  long in_FS_OFFSET;
  base_uint<256U> a;
  base_uint<256U> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = local_40.pn;
  base_uint((base_uint<256U> *)this_00);
  lVar2 = 8;
  lVar3 = 0;
  do {
    uVar1 = this->pn[lVar3];
    lVar4 = 0;
    uVar5 = 0;
    do {
      uVar5 = (ulong)b->pn[lVar4] * (ulong)uVar1 + this_00[lVar4] + uVar5;
      this_00[lVar4] = (uint32_t)uVar5;
      uVar5 = uVar5 >> 0x20;
      lVar4 = lVar4 + 1;
    } while (lVar2 != lVar4);
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + -1;
    this_00 = this_00 + 1;
  } while (lVar3 != 8);
  if (&local_40 != this) {
    *(undefined8 *)(this->pn + 4) = local_40.pn._16_8_;
    *(undefined8 *)(this->pn + 6) = local_40.pn._24_8_;
    this->pn[0] = local_40.pn[0];
    this->pn[1] = local_40.pn[1];
    this->pn[2] = local_40.pn[2];
    this->pn[3] = local_40.pn[3];
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

base_uint<BITS>& base_uint<BITS>::operator*=(const base_uint& b)
{
    base_uint<BITS> a;
    for (int j = 0; j < WIDTH; j++) {
        uint64_t carry = 0;
        for (int i = 0; i + j < WIDTH; i++) {
            uint64_t n = carry + a.pn[i + j] + (uint64_t)pn[j] * b.pn[i];
            a.pn[i + j] = n & 0xffffffff;
            carry = n >> 32;
        }
    }
    *this = a;
    return *this;
}